

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppunfix5.h
# Opt level: O2

void __thiscall pointprocess::initAkse(pointprocess *this,int i,double lgd)

{
  ostream *poVar1;
  
  if (((uint)i < 3) && (i < this->k)) {
    this->akse[(uint)i] = lgd;
    this->s = -1;
    this->sw = -1;
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Akse-nummer er ugyldigt");
  std::endl<char,std::char_traits<char>>(poVar1);
  abort();
}

Assistant:

void pointprocess :: initAkse ( int i, double lgd )
{
  if ( i < k && (( i==0 ) || ( i==1 ) ||  (i==2 )) )
    akse[i] = lgd;
  else { cout << "Akse-nummer er ugyldigt" << endl; abort(); }

  s = -1;
  sw = -1;

}